

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GPUShaderFP64Test9::getOperationTypeString_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test9 *this,_operation_type *operation_type)

{
  TestError *this_00;
  allocator<char> local_22;
  undefined1 local_21;
  _operation_type *local_20;
  _operation_type *operation_type_local;
  GPUShaderFP64Test9 *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = operation_type;
  operation_type_local = (_operation_type *)this;
  this_local = (GPUShaderFP64Test9 *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[?]",&local_22);
  std::allocator<char>::~allocator(&local_22);
  switch(*local_20) {
  case OPERATION_TYPE_ADDITION:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"addition");
    break;
  case OPERATION_TYPE_DIVISION:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"division");
    break;
  case OPERATION_TYPE_MULTIPLICATION:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"multiplication");
    break;
  case OPERATION_TYPE_SUBTRACTION:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"subtraction");
    break;
  case OPERATION_TYPE_PRE_DECREMENTATION:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"pre-decrementation");
    break;
  case OPERATION_TYPE_PRE_INCREMENTATION:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"pre-incrementation");
    break;
  case OPERATION_TYPE_POST_DECREMENTATION:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"post-decrementation");
    break;
  case OPERATION_TYPE_POST_INCREMENTATION:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"post-incrementation");
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized operation type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x2c8c);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test9::getOperationTypeString(const _operation_type& operation_type)
{
	std::string result = "[?]";

	switch (operation_type)
	{
	case OPERATION_TYPE_ADDITION:
		result = "addition";
		break;
	case OPERATION_TYPE_DIVISION:
		result = "division";
		break;
	case OPERATION_TYPE_MULTIPLICATION:
		result = "multiplication";
		break;
	case OPERATION_TYPE_SUBTRACTION:
		result = "subtraction";
		break;
	case OPERATION_TYPE_PRE_DECREMENTATION:
		result = "pre-decrementation";
		break;
	case OPERATION_TYPE_PRE_INCREMENTATION:
		result = "pre-incrementation";
		break;
	case OPERATION_TYPE_POST_DECREMENTATION:
		result = "post-decrementation";
		break;
	case OPERATION_TYPE_POST_INCREMENTATION:
		result = "post-incrementation";
		break;

	default:
	{
		TCU_FAIL("Unrecognized operation type");
	}
	}

	return result;
}